

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

int unzSetOffset64(unzFile file,ZPOS64_T pos)

{
  int iVar1;
  
  if (file != (unzFile)0x0) {
    *(ZPOS64_T *)((long)file + 0x88) = pos;
    *(undefined8 *)((long)file + 0x80) = *(undefined8 *)((long)file + 0x68);
    iVar1 = unz64local_GetCurrentFileInfoInternal
                      (file,(unz_file_info64 *)((long)file + 0xb0),
                       (unz_file_info64_internal *)((long)file + 0x138),(char *)0x0,0,(void *)0x0,0,
                       (char *)0x0,0);
    *(ulong *)((long)file + 0x90) = (ulong)(iVar1 == 0);
    return iVar1;
  }
  return -0x66;
}

Assistant:

extern int ZEXPORT unzSetOffset64(unzFile file, ZPOS64_T pos)
{
    unz64_s* s;
    int err;

    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;

    s->pos_in_central_dir = pos;
    s->num_file = s->gi.number_entry;      /* hack */
    err = unz64local_GetCurrentFileInfoInternal(file, &s->cur_file_info,
        &s->cur_file_info_internal,
        NULL, 0, NULL, 0, NULL, 0);
    s->current_file_ok = (err == UNZ_OK);
    return err;
}